

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_write_header(p_ply ply)

{
  int iVar1;
  p_ply_element ptVar2;
  p_ply_property_conflict ptVar3;
  p_ply in_RDI;
  p_ply_property_conflict property;
  p_ply_element element;
  long j;
  long i;
  long local_20;
  long local_18;
  uint local_4;
  
  iVar1 = fprintf((FILE *)in_RDI->fp,"ply\nformat %s 1.0\n",
                  ply_storage_mode_list[in_RDI->storage_mode]);
  if (iVar1 < 1) {
LAB_006938ac:
    ply_ferror(in_RDI,"Error writing to file");
    local_4 = 0;
  }
  else {
    for (local_18 = 0; local_18 < in_RDI->ncomments; local_18 = local_18 + 1) {
      iVar1 = fprintf((FILE *)in_RDI->fp,"comment %s\n",in_RDI->comment + local_18 * 0x400);
      if (iVar1 < 1) goto LAB_006938ac;
    }
    for (local_18 = 0; local_18 < in_RDI->nobj_infos; local_18 = local_18 + 1) {
      iVar1 = fprintf((FILE *)in_RDI->fp,"obj_info %s\n",in_RDI->obj_info + local_18 * 0x400);
      if (iVar1 < 1) goto LAB_006938ac;
    }
    for (local_18 = 0; local_18 < in_RDI->nelements; local_18 = local_18 + 1) {
      ptVar2 = in_RDI->element + local_18;
      iVar1 = fprintf((FILE *)in_RDI->fp,"element %s %ld\n",ptVar2,ptVar2->ninstances);
      if (iVar1 < 1) goto LAB_006938ac;
      for (local_20 = 0; local_20 < ptVar2->nproperties; local_20 = local_20 + 1) {
        ptVar3 = ptVar2->property + local_20;
        if (ptVar3->type == PLY_LIST) {
          iVar1 = fprintf((FILE *)in_RDI->fp,"property list %s %s %s\n",
                          ply_type_list[ptVar3->length_type],ply_type_list[ptVar3->value_type],
                          ptVar3);
        }
        else {
          iVar1 = fprintf((FILE *)in_RDI->fp,"property %s %s\n",ply_type_list[ptVar3->type],ptVar3);
        }
        if (iVar1 < 1) goto LAB_006938ac;
      }
    }
    iVar1 = fprintf((FILE *)in_RDI->fp,"end_header\n");
    local_4 = (uint)(0 < iVar1);
  }
  return local_4;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0)
        goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE * i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE * i) <=
            0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0)
            goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0)
                    goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type], property->name) <= 0)
                    goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}